

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPELinker.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsWindowsPELinker::ScanDependencies
          (cmBinUtilsWindowsPELinker *this,string *file,TargetType param_2)

{
  cmRuntimeDependencyArchive *this_00;
  undefined8 name;
  bool bVar1;
  uint uVar2;
  pointer pcVar3;
  size_type __n;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>_> __result;
  difference_type __n_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  bool local_119;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_118;
  bool unique;
  undefined8 local_110;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  undefined8 local_f8;
  bool local_e9;
  undefined1 local_e8 [7];
  bool resolved;
  string path;
  WinPEDependency *lib;
  iterator __end1;
  iterator __begin1;
  vector<WinPEDependency,_std::allocator<WinPEDependency>_> *__range1;
  string origin;
  undefined1 local_68 [8];
  vector<WinPEDependency,_std::allocator<WinPEDependency>_> depends;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  needed;
  TargetType param_3_local;
  string *file_local;
  cmBinUtilsWindowsPELinker *this_local;
  
  needed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = param_2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  pcVar3 = std::
           unique_ptr<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
           ::operator->(&this->Tool);
  uVar2 = (*pcVar3->_vptr_cmBinUtilsWindowsPEGetRuntimeDependenciesTool[2])
                    (pcVar3,file,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = 0;
    depends.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>::vector
              ((vector<WinPEDependency,_std::allocator<WinPEDependency>_> *)local_68);
    __n = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
    std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>::reserve
              ((vector<WinPEDependency,_std::allocator<WinPEDependency>_> *)local_68,__n);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_40);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
    __result = std::
               back_inserter<std::vector<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency,std::allocator<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>>>
                         ((vector<WinPEDependency,_std::allocator<WinPEDependency>_> *)local_68);
    origin.field_2._8_8_ =
         std::
         move<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency,std::allocator<cmBinUtilsWindowsPELinker::ScanDependencies(std::__cxx11::string_const&,cmStateEnums::TargetType)::WinPEDependency>>>>
                   ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )__first._M_current,
                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )__last._M_current,__result);
    cmsys::SystemTools::GetFilenamePath((string *)&__range1,file);
    __end1 = std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>::begin
                       ((vector<WinPEDependency,_std::allocator<WinPEDependency>_> *)local_68);
    lib = (WinPEDependency *)
          std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>::end
                    ((vector<WinPEDependency,_std::allocator<WinPEDependency>_> *)local_68);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<WinPEDependency_*,_std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>_>
                                       *)&lib), bVar1) {
      path.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<WinPEDependency_*,_std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>_>
           ::operator*(&__end1);
      bVar1 = cmRuntimeDependencyArchive::IsPreExcluded
                        ((this->super_cmBinUtilsLinker).Archive,
                         &((reference)path.field_2._8_8_)->LowerCase);
      if (!bVar1) {
        std::__cxx11::string::string((string *)local_e8);
        local_e9 = false;
        bVar1 = ResolveDependency(this,(string *)(path.field_2._8_8_ + 0x20),(string *)&__range1,
                                  (string *)local_e8,&local_e9);
        if (bVar1) {
          if ((local_e9 & 1U) == 0) {
            cmRuntimeDependencyArchive::AddUnresolvedPath
                      ((this->super_cmBinUtilsLinker).Archive,(string *)path.field_2._8_8_);
          }
          else {
            bVar1 = cmRuntimeDependencyArchive::IsPostExcluded
                              ((this->super_cmBinUtilsLinker).Archive,(string *)local_e8);
            if (!bVar1) {
              local_108._M_current = (char *)std::__cxx11::string::end();
              __n_00 = std::__cxx11::string::size();
              local_100 = __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator-(&local_108,__n_00);
              __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
              __normal_iterator<char*>
                        ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_f8,&local_100
                        );
              _Stack_118._M_current = (char *)std::__cxx11::string::end();
              __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
              __normal_iterator<char*>
                        ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_110,
                         &stack0xfffffffffffffee8);
              std::__cxx11::string::replace(local_e8,local_f8,local_110,path.field_2._8_8_);
              name = path.field_2._8_8_;
              this_00 = (this->super_cmBinUtilsLinker).Archive;
              local_138.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_138.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_138.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_138);
              cmRuntimeDependencyArchive::AddResolvedPath
                        (this_00,(string *)name,(string *)local_e8,&local_119,&local_138);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_138);
              if (((local_119 & 1U) != 0) &&
                 (uVar2 = (*(this->super_cmBinUtilsLinker)._vptr_cmBinUtilsLinker[3])
                                    (this,local_e8,2), (uVar2 & 1) == 0)) {
                this_local._7_1_ = 0;
                depends.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                goto LAB_00c4b2aa;
              }
            }
          }
          depends.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        }
        else {
          this_local._7_1_ = 0;
          depends.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
LAB_00c4b2aa:
        std::__cxx11::string::~string((string *)local_e8);
        if ((int)depends.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_00c4b2ed;
      }
      __gnu_cxx::
      __normal_iterator<WinPEDependency_*,_std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = 1;
    depends.super__Vector_base<WinPEDependency,_std::allocator<WinPEDependency>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
LAB_00c4b2ed:
    std::__cxx11::string::~string((string *)&__range1);
    std::vector<WinPEDependency,_std::allocator<WinPEDependency>_>::~vector
              ((vector<WinPEDependency,_std::allocator<WinPEDependency>_> *)local_68);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmBinUtilsWindowsPELinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType /* unused */)
{
  std::vector<std::string> needed;
  if (!this->Tool->GetFileInfo(file, needed)) {
    return false;
  }

  struct WinPEDependency
  {
    WinPEDependency(std::string o)
      : Original(std::move(o))
      , LowerCase(cmSystemTools::LowerCase(Original))
    {
    }
    std::string const Original;
    std::string const LowerCase;
  };

  std::vector<WinPEDependency> depends;
  depends.reserve(needed.size());
  std::move(needed.begin(), needed.end(), std::back_inserter(depends));
  std::string origin = cmSystemTools::GetFilenamePath(file);

  for (auto const& lib : depends) {
    if (!this->Archive->IsPreExcluded(lib.LowerCase)) {
      std::string path;
      bool resolved = false;
      if (!this->ResolveDependency(lib.LowerCase, origin, path, resolved)) {
        return false;
      }
      if (resolved) {
        if (!this->Archive->IsPostExcluded(path)) {
#ifdef _WIN32
          ReplaceWithActualNameCasing(path);
#else
          path.replace(path.end() - lib.Original.size(), path.end(),
                       lib.Original);
#endif
          bool unique;
          this->Archive->AddResolvedPath(lib.Original, path, unique);
          if (unique &&
              !this->ScanDependencies(path, cmStateEnums::SHARED_LIBRARY)) {
            return false;
          }
        }
      } else {
        this->Archive->AddUnresolvedPath(lib.Original);
      }
    }
  }

  return true;
}